

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_null<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  basic_value<toml::type_config> *v;
  region reg;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  literal local_410;
  region local_3f8;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined8 local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_348;
  element_type *peStack_338;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  undefined8 local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  pointer local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  size_t local_2a0;
  size_t sStack_298;
  size_t local_290;
  element_type *peStack_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  location local_260;
  source_location local_218;
  basic_value<toml::type_config> local_1a0;
  failure<toml::error_info> local_d8;
  failure<toml::error_info> local_80;
  
  if ((ctx->toml_spec_).ext_null_value == false) {
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_430,
               "toml::parse_null: invalid spec: spec.ext_null_value must be true.","");
    region::region((region *)local_328,loc);
    source_location::source_location(&local_218,(region *)local_328);
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"here","");
    make_error_info<>((error_info *)local_390,&local_430,&local_218,&local_450);
    err<toml::error_info>(&local_80,(error_info *)local_390);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_80);
    failure<toml::error_info>::~failure(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.field_2._8_8_ != &aStack_348) {
      operator_delete((void *)local_370.field_2._8_8_,aStack_348._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_370);
    if ((basic_value<toml::type_config> *)local_390._0_8_ !=
        (basic_value<toml::type_config> *)local_380) {
      operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_218);
    region::~region((region *)local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_328._0_8_ = &PTR__scanner_base_005289f8;
    local_328._8_8_ = (long)"Failed getting file size. fd is null" + 0x20;
    local_318._M_allocated_capacity = 4;
    literal::scan((region *)local_390,(literal *)local_328,loc);
    uVar2 = local_380._8_8_;
    uVar3 = local_390._8_8_;
    uVar1 = local_390._0_8_;
    if ((basic_value<toml::type_config> *)local_390._0_8_ == (basic_value<toml::type_config> *)0x0)
    {
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_470,"toml::parse_null: invalid null: null must be lowercase. ","")
      ;
      local_410.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005289f8;
      local_410.value_ = "null";
      local_410.size_ = 4;
      location::location(&local_260,loc);
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"");
      make_syntax_error<toml::detail::literal>
                ((error_info *)local_328,&local_470,&local_410,&local_260,&local_490);
      err<toml::error_info>(&local_d8,(error_info *)local_328);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_d8);
      failure<toml::error_info>::~failure(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0 != &local_2e0) {
        operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_308);
      if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
        operator_delete((void *)local_328._0_8_,(ulong)(local_318._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_390._0_8_ = (basic_value<toml::type_config> *)0x0;
      local_390._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_3f8.source_name_._M_dataplus._M_p = (pointer)&local_3f8.source_name_.field_2;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380._0_8_ ==
          &local_370) {
        local_3f8.source_name_.field_2._8_8_ = local_370._M_string_length;
        local_380._0_8_ = local_3f8.source_name_._M_dataplus._M_p;
      }
      local_3f8.source_name_.field_2._M_allocated_capacity._1_7_ = local_370._M_dataplus._M_p._1_7_;
      local_3f8.source_name_.field_2._M_local_buf[0] = local_370._M_dataplus._M_p._0_1_;
      local_380._8_8_ = 0;
      local_370._M_dataplus._M_p._0_1_ = '\0';
      local_3f8.length_ = local_370.field_2._M_allocated_capacity;
      local_3f8.first_ = local_370.field_2._8_8_;
      local_3f8.first_line_ = local_350;
      local_3f8.first_column_ = aStack_348._M_allocated_capacity;
      local_3f8.last_ = aStack_348._8_8_;
      local_3f8.last_line_ = (size_t)peStack_338;
      local_3f8.last_column_ = (size_t)local_330._M_pi;
      local_328._0_8_ = local_328._0_8_ & 0xffffffffffffff00;
      local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
      local_2e0._M_allocated_capacity = uVar1;
      local_2e0._8_8_ = uVar3;
      local_3f8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_3f8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar3 = local_3f8.source_name_.field_2._M_allocated_capacity;
      local_2d0._M_p = (pointer)local_380._0_8_;
      if ((pointer)local_380._0_8_ == local_3f8.source_name_._M_dataplus._M_p) {
        local_2c0._M_string_length = local_3f8.source_name_.field_2._8_8_;
        uVar3 = uVar1;
        local_2d0._M_p = (pointer)&local_2c0;
      }
      local_2c8 = (pointer)uVar2;
      local_3f8.source_name_._M_string_length = 0;
      local_3f8.source_name_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_370._M_dataplus._M_p._1_7_ << 8;
      local_2c0.field_2._M_allocated_capacity = local_370.field_2._M_allocated_capacity;
      local_2c0.field_2._8_8_ = local_370.field_2._8_8_;
      local_2a0 = local_350;
      sStack_298 = aStack_348._M_allocated_capacity;
      local_290 = aStack_348._8_8_;
      peStack_288 = peStack_338;
      local_280 = local_330._M_pi;
      local_278.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_380._0_8_ = &local_370;
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_1a0,(toml *)local_328,
                 (basic_value<toml::type_config> *)uVar3);
      __return_storage_ptr__->is_ok_ = true;
      v = &local_1a0;
      basic_value<toml::type_config>::basic_value(&(__return_storage_ptr__->field_1).succ_.value,v);
      basic_value<toml::type_config>::cleanup(&local_1a0,(EVP_PKEY_CTX *)v);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a0.comments_);
      region::~region(&local_1a0.region_);
      basic_value<toml::type_config>::cleanup
                ((basic_value<toml::type_config> *)local_328,(EVP_PKEY_CTX *)v);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_278);
      region::~region((region *)&local_2e0);
      region::~region(&local_3f8);
    }
    region::~region((region *)local_390);
  }
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_null(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    if( ! spec.ext_null_value)
    {
        return err(make_error_info("toml::parse_null: "
            "invalid spec: spec.ext_null_value must be true.",
            source_location(region(loc)), "here"));
    }

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::null_value(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_null: "
            "invalid null: null must be lowercase. ",
            syntax::null_value(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    // ----------------------------------------------------------------------
    // no format info for boolean

    return ok(basic_value<TC>(detail::none_t{}, std::move(reg)));
}